

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_symbolic_physical.cpp
# Opt level: O2

void symbolic_to_physical(block_size_descriptor *bsd,symbolic_compressed_block *scb,uint8_t *pcb)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint16_t uVar4;
  quant_method quant_level;
  uint i;
  uint uVar5;
  block_mode *pbVar6;
  byte *pbVar7;
  int i_4;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  int bitoffset;
  anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *paVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  undefined8 local_b0;
  uint8_t weightbuf [16];
  uint8_t values_to_encode [32];
  uint8_t weights [64];
  
  uVar1 = scb->block_type;
  if (uVar1 == '\x01') {
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      pcb[lVar14] = symbolic_to_physical(block_size_descriptor_const&,symbolic_compressed_block_const&,unsigned_char*)
                    ::cbytes[lVar14];
    }
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      pcb[lVar14 * 2 + 8] = scb->color_formats[lVar14 * 4 + 0xc];
      pcb[lVar14 * 2 + 9] = scb->color_formats[lVar14 * 4 + 0xd];
    }
  }
  else if (uVar1 == '\x02') {
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      pcb[lVar14] = symbolic_to_physical::cbytes[lVar14];
    }
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      pcb[lVar14 * 2 + 8] = scb->color_formats[lVar14 * 4 + 0xc];
      pcb[lVar14 * 2 + 9] = scb->color_formats[lVar14 * 4 + 0xd];
    }
  }
  else {
    if (uVar1 == '\0') {
      __assert_fail("scb.block_type != SYM_BTYPE_ERROR",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_symbolic_physical.cpp"
                    ,0x6b,
                    "void symbolic_to_physical(const block_size_descriptor &, const symbolic_compressed_block &, uint8_t *)"
                   );
    }
    local_b0 = (ulong)scb->partition_count;
    weightbuf[0] = '\0';
    weightbuf[1] = '\0';
    weightbuf[2] = '\0';
    weightbuf[3] = '\0';
    weightbuf[4] = '\0';
    weightbuf[5] = '\0';
    weightbuf[6] = '\0';
    weightbuf[7] = '\0';
    weightbuf[8] = '\0';
    weightbuf[9] = '\0';
    weightbuf[10] = '\0';
    weightbuf[0xb] = '\0';
    weightbuf[0xc] = '\0';
    weightbuf[0xd] = '\0';
    weightbuf[0xe] = '\0';
    weightbuf[0xf] = '\0';
    pbVar6 = block_size_descriptor::get_block_mode(bsd,(uint)scb->block_mode);
    bVar10 = bsd->decimation_tables[pbVar6->decimation_mode].weight_count;
    bVar2 = pbVar6->quant_mode;
    if (bVar2 < 0x15) {
      fVar19 = *(float *)(&DAT_00318be4 + (ulong)(uint)bVar2 * 4);
    }
    else {
      fVar19 = -1.0;
    }
    bVar3 = pbVar6->field_0x5;
    uVar16 = (uint)bVar10 << (bVar3 & 1);
    uVar5 = get_ise_sequence_bitcount(uVar16,(uint)bVar2);
    uVar12 = local_b0;
    uVar9 = 0;
    if ((bVar3 & 1) == 0) {
      for (; bVar10 != uVar9; uVar9 = uVar9 + 1) {
        weights[uVar9] =
             quant_and_xfer_tables[bVar2].scramble_map
             [(int)(fVar19 * (float)scb->weights[uVar9] * 0.015625 + 0.5)];
      }
    }
    else {
      for (; bVar10 != uVar9; uVar9 = uVar9 + 1) {
        weights[uVar9 * 2] =
             quant_and_xfer_tables[bVar2].scramble_map
             [(int)(fVar19 * (float)scb->weights[uVar9] * 0.015625 + 0.5)];
        weights[uVar9 * 2 + 1] =
             quant_and_xfer_tables[bVar2].scramble_map
             [(int)(fVar19 * (float)scb->weights[uVar9 + 0x20] * 0.015625 + 0.5)];
      }
    }
    encode_ise((uint)bVar2,uVar16,weights,weightbuf,0);
    pbVar7 = pcb;
    lVar14 = 0x10;
    while (lVar14 != 0) {
      bVar10 = weightbuf[lVar14 + -1] << 4 | weightbuf[lVar14 + -1] >> 4;
      bVar10 = bVar10 >> 2 & 0x33 | (bVar10 & 0x33) << 2;
      *pbVar7 = bVar10 >> 1 & 0x55 | (bVar10 & 0x55) * '\x02';
      pbVar7 = pbVar7 + 1;
      lVar14 = lVar14 + -1;
    }
    uVar4 = scb->block_mode;
    *pcb = (uint8_t)uVar4;
    pcb[1] = (byte)uVar12 * '\b' + 0x18 & 0x18 | (byte)(uVar4 >> 8) & 7 | pcb[1] & 0xe0;
    iVar18 = 0x80 - uVar5;
    if ((byte)uVar12 < 2) {
      uVar5 = (uint)scb->color_formats[0];
      iVar8 = 4;
      bitoffset = 0xd;
    }
    else {
      write_bits((uint)scb->partition_index,6,0xd,pcb);
      pcb[2] = (byte)(scb->partition_index >> 3) & 0x78 | pcb[2] & 0x87;
      if (scb->color_formats_matched == '\0') {
        uVar9 = uVar12 & 0xffffffff;
        uVar5 = 4;
        for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
          uVar16 = (uint)(scb->color_formats[uVar13] >> 2);
          if (uVar16 < uVar5) {
            uVar5 = uVar16;
          }
        }
        uVar16 = 2;
        if (uVar5 != 3) {
          uVar16 = uVar5;
        }
        uVar17 = uVar16 + 1;
        for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
          uVar17 = uVar17 | (scb->color_formats[uVar13] >> 2) - uVar16 << ((char)uVar13 + 2U & 0x1f)
          ;
        }
        iVar8 = (int)uVar12;
        for (uVar13 = 0; iVar8 = iVar8 + 2, uVar13 != uVar9; uVar13 = uVar13 + 1) {
          uVar17 = uVar17 | (scb->color_formats[uVar13] & 3) << ((byte)iVar8 & 0x1f);
        }
        uVar5 = (int)uVar17 >> 6;
        iVar8 = (int)uVar12 * 3 + -4;
        iVar18 = iVar18 - iVar8;
        write_bits(uVar17 & 0x3f,6,0x17,pcb);
        bitoffset = iVar18;
      }
      else {
        uVar5 = (uint)scb->color_formats[0] << 2;
        iVar8 = 6;
        bitoffset = 0x17;
      }
    }
    write_bits(uVar5,iVar8,bitoffset,pcb);
    if ((bVar3 & 1) != 0) {
      write_bits((int)scb->plane2_component,2,iVar18 + -2,pcb);
    }
    quant_level = scb->quant_mode;
    bVar10 = scb->partition_count;
    paVar11 = &scb->field_9;
    uVar12 = 0;
    for (uVar9 = 0; uVar9 != bVar10; uVar9 = uVar9 + 1) {
      uVar5 = scb->color_formats[uVar9] >> 1 & 0xfffffffe;
      if (6 < (byte)uVar5) {
        __assert_fail("vals <= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_symbolic_physical.cpp"
                      ,0x114,
                      "void symbolic_to_physical(const block_size_descriptor &, const symbolic_compressed_block &, uint8_t *)"
                     );
      }
      lVar14 = (ulong)uVar5 + 2;
      for (lVar15 = 0; lVar14 != lVar15; lVar15 = lVar15 + 1) {
        values_to_encode[lVar15 + uVar12] =
             *(uint8_t *)
              ((long)(int)quant_level * 0x100 + 0x31e3a0 + (ulong)*(byte *)((long)paVar11 + lVar15))
        ;
      }
      uVar12 = (ulong)((uint)uVar12 + (int)lVar14);
      paVar11 = (anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *)((long)paVar11 + 8);
    }
    uVar5 = 0x1d;
    if (bVar10 == 1) {
      uVar5 = 0x11;
    }
    encode_ise(quant_level,(uint)uVar12,values_to_encode,pcb,uVar5);
  }
  return;
}

Assistant:

void symbolic_to_physical(
	const block_size_descriptor& bsd,
	const symbolic_compressed_block& scb,
	uint8_t pcb[16]
) {
	assert(scb.block_type != SYM_BTYPE_ERROR);

	// Constant color block using UNORM16 colors
	if (scb.block_type == SYM_BTYPE_CONST_U16)
	{
		// There is currently no attempt to coalesce larger void-extents
		static const uint8_t cbytes[8] { 0xFC, 0xFD, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };
		for (unsigned int i = 0; i < 8; i++)
		{
			pcb[i] = cbytes[i];
		}

		for (unsigned int i = 0; i < BLOCK_MAX_COMPONENTS; i++)
		{
			pcb[2 * i + 8] = scb.constant_color[i] & 0xFF;
			pcb[2 * i + 9] = (scb.constant_color[i] >> 8) & 0xFF;
		}

		return;
	}

	// Constant color block using FP16 colors
	if (scb.block_type == SYM_BTYPE_CONST_F16)
	{
		// There is currently no attempt to coalesce larger void-extents
		static const uint8_t cbytes[8]  { 0xFC, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };
		for (unsigned int i = 0; i < 8; i++)
		{
			pcb[i] = cbytes[i];
		}

		for (unsigned int i = 0; i < BLOCK_MAX_COMPONENTS; i++)
		{
			pcb[2 * i + 8] = scb.constant_color[i] & 0xFF;
			pcb[2 * i + 9] = (scb.constant_color[i] >> 8) & 0xFF;
		}

		return;
	}

	unsigned int partition_count = scb.partition_count;

	// Compress the weights.
	// They are encoded as an ordinary integer-sequence, then bit-reversed
	uint8_t weightbuf[16] { 0 };

	const auto& bm = bsd.get_block_mode(scb.block_mode);
	const auto& di = bsd.get_decimation_info(bm.decimation_mode);
	int weight_count = di.weight_count;
	quant_method weight_quant_method = bm.get_weight_quant_mode();
	float weight_quant_levels = static_cast<float>(get_quant_level(weight_quant_method));
	int is_dual_plane = bm.is_dual_plane;

	const auto& qat = quant_and_xfer_tables[weight_quant_method];

	int real_weight_count = is_dual_plane ? 2 * weight_count : weight_count;

	int bits_for_weights = get_ise_sequence_bitcount(real_weight_count, weight_quant_method);

	uint8_t weights[64];
	if (is_dual_plane)
	{
		for (int i = 0; i < weight_count; i++)
		{
			float uqw = static_cast<float>(scb.weights[i]);
			float qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			int qwi = static_cast<int>(qw + 0.5f);
			weights[2 * i] = qat.scramble_map[qwi];

			uqw = static_cast<float>(scb.weights[i + WEIGHTS_PLANE2_OFFSET]);
			qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			qwi = static_cast<int>(qw + 0.5f);
			weights[2 * i + 1] = qat.scramble_map[qwi];
		}
	}
	else
	{
		for (int i = 0; i < weight_count; i++)
		{
			float uqw = static_cast<float>(scb.weights[i]);
			float qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			int qwi = static_cast<int>(qw + 0.5f);
			weights[i] = qat.scramble_map[qwi];
		}
	}

	encode_ise(weight_quant_method, real_weight_count, weights, weightbuf, 0);

	for (int i = 0; i < 16; i++)
	{
		pcb[i] = static_cast<uint8_t>(bitrev8(weightbuf[15 - i]));
	}

	write_bits(scb.block_mode, 11, 0, pcb);
	write_bits(partition_count - 1, 2, 11, pcb);

	int below_weights_pos = 128 - bits_for_weights;

	// Encode partition index and color endpoint types for blocks with 2+ partitions
	if (partition_count > 1)
	{
		write_bits(scb.partition_index, 6, 13, pcb);
		write_bits(scb.partition_index >> 6, PARTITION_INDEX_BITS - 6, 19, pcb);

		if (scb.color_formats_matched)
		{
			write_bits(scb.color_formats[0] << 2, 6, 13 + PARTITION_INDEX_BITS, pcb);
		}
		else
		{
			// Check endpoint types for each partition to determine the lowest class present
			int low_class = 4;

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int class_of_format = scb.color_formats[i] >> 2;
				low_class = astc::min(class_of_format, low_class);
			}

			if (low_class == 3)
			{
				low_class = 2;
			}

			int encoded_type = low_class + 1;
			int bitpos = 2;

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int classbit_of_format = (scb.color_formats[i] >> 2) - low_class;
				encoded_type |= classbit_of_format << bitpos;
				bitpos++;
			}

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int lowbits_of_format = scb.color_formats[i] & 3;
				encoded_type |= lowbits_of_format << bitpos;
				bitpos += 2;
			}

			int encoded_type_lowpart = encoded_type & 0x3F;
			int encoded_type_highpart = encoded_type >> 6;
			int encoded_type_highpart_size = (3 * partition_count) - 4;
			int encoded_type_highpart_pos = 128 - bits_for_weights - encoded_type_highpart_size;
			write_bits(encoded_type_lowpart, 6, 13 + PARTITION_INDEX_BITS, pcb);
			write_bits(encoded_type_highpart, encoded_type_highpart_size, encoded_type_highpart_pos, pcb);
			below_weights_pos -= encoded_type_highpart_size;
		}
	}
	else
	{
		write_bits(scb.color_formats[0], 4, 13, pcb);
	}

	// In dual-plane mode, encode the color component of the second plane of weights
	if (is_dual_plane)
	{
		write_bits(scb.plane2_component, 2, below_weights_pos - 2, pcb);
	}

	// Encode the color components
	uint8_t values_to_encode[32];
	int valuecount_to_encode = 0;

	const uint8_t* pack_table = color_uquant_to_scrambled_pquant_tables[scb.quant_mode - QUANT_6];
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		int vals = 2 * (scb.color_formats[i] >> 2) + 2;
		assert(vals <= 8);
		for (int j = 0; j < vals; j++)
		{
			values_to_encode[j + valuecount_to_encode] = pack_table[scb.color_values[i][j]];
		}
		valuecount_to_encode += vals;
	}

	encode_ise(scb.get_color_quant_mode(), valuecount_to_encode, values_to_encode, pcb,
	           scb.partition_count == 1 ? 17 : 19 + PARTITION_INDEX_BITS);
}